

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

void __thiscall duckdb::LogicalAggregate::Serialize(LogicalAggregate *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,200,"expressions",&(this->super_LogicalOperator).expressions);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xc9,"group_index",&this->group_index);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xca,"aggregate_index",&this->aggregate_index);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xcb,"groupings_index",&this->groupings_index);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,0xcc,"groups",&this->groups);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,true>>
            (serializer,0xcd,"grouping_sets",&this->grouping_sets);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::vector<unsigned_long,false>,true>>
            (serializer,0xce,"grouping_functions",&this->grouping_functions);
  return;
}

Assistant:

void LogicalAggregate::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WritePropertyWithDefault<vector<unique_ptr<Expression>>>(200, "expressions", expressions);
	serializer.WritePropertyWithDefault<idx_t>(201, "group_index", group_index);
	serializer.WritePropertyWithDefault<idx_t>(202, "aggregate_index", aggregate_index);
	serializer.WritePropertyWithDefault<idx_t>(203, "groupings_index", groupings_index);
	serializer.WritePropertyWithDefault<vector<unique_ptr<Expression>>>(204, "groups", groups);
	serializer.WritePropertyWithDefault<vector<GroupingSet>>(205, "grouping_sets", grouping_sets);
	serializer.WritePropertyWithDefault<vector<unsafe_vector<idx_t>>>(206, "grouping_functions", grouping_functions);
}